

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfdcapi_common_CfdEncodeDecodeBase58Check_Test::TestBody
          (cfdcapi_common_CfdEncodeDecodeBase58Check_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *exp;
  char *target_data;
  char *output;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffdf8;
  AssertionResult *in_stack_fffffffffffffe00;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  char *in_stack_fffffffffffffe10;
  AssertionResult *in_stack_fffffffffffffe18;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  AssertHelper local_f8;
  Message local_f0;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  char *local_b0;
  char *local_a8;
  string local_98 [7];
  undefined1 in_stack_ffffffffffffff6f;
  char *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffbf;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)in_stack_fffffffffffffe18);
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffe18->success_,in_stack_fffffffffffffe10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (int *)in_stack_fffffffffffffe00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffffb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32940a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x26e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&stack0xffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
    testing::Message::~Message((Message *)0x32946d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3294c2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(type *)0x3294f3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x26f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string(local_98);
    testing::Message::~Message((Message *)0x3295ec);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x329667);
  pcVar2 = (char *)0x0;
  local_a8 = 
  "0488b21e051431616f00000000e6ba4088246b104837c62bd01fd8ba1cf2931ad1a5376c2360a1f112f2cfc63c02acf89ab4e3daa79bceef2ebecee2af92712e6bf5e4b0d10c74bbecc27ac13da8"
  ;
  local_b0 = 
  "xpub6FZeZ5vwcYiT6r7ZYKJhyUqBxMBvzSmb6SpPQCsSenGPrVjKk5SGW4JJpc7cKERN8w9KnJZcMgJA4B2cHnpGq5TahYrDvZSBY2EMLKPRMTT"
  ;
  local_14 = CfdEncodeBase58((void *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                             (bool)in_stack_ffffffffffffff6f,(char **)0x0);
  local_c4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffe18->success_,in_stack_fffffffffffffe10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (int *)in_stack_fffffffffffffe00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x32975b);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x275,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x3297b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x32980d);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ((internal *)&local_e8,"exp","output",local_b0,pcVar2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3298b1);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x277,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message((Message *)0x32990e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x329963);
    CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    pcVar2 = (char *)0x0;
  }
  local_14 = CfdDecodeBase58(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                             (bool)in_stack_ffffffffffffffbf,
                             (char **)in_stack_ffffffffffffffb0.data_);
  local_10c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffe18->success_,in_stack_fffffffffffffe10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (int *)in_stack_fffffffffffffe00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x329a48);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x27d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message((Message *)0x329aa5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x329afa);
  if (local_14 == 0) {
    in_stack_fffffffffffffe18 = &local_130;
    testing::internal::CmpHelperSTREQ
              ((internal *)in_stack_fffffffffffffe18,"target_data","output",local_a8,pcVar2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffe18);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      in_stack_fffffffffffffe10 =
           testing::AssertionResult::failure_message((AssertionResult *)0x329b9e);
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x27f,in_stack_fffffffffffffe10);
      testing::internal::AssertHelper::operator=(&local_140,&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      testing::Message::~Message((Message *)0x329bfb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x329c50);
    CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  }
  local_14 = CfdFreeHandle((void *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  local_154 = 0;
  this_00 = &local_150;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffe18->success_,in_stack_fffffffffffffe10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x329d20);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x285,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message((Message *)0x329d7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x329dd0);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdEncodeDecodeBase58Check) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* output = nullptr;
  const char* target_data = "0488b21e051431616f00000000e6ba4088246b104837c62bd01fd8ba1cf2931ad1a5376c2360a1f112f2cfc63c02acf89ab4e3daa79bceef2ebecee2af92712e6bf5e4b0d10c74bbecc27ac13da8";
  const char* exp = "xpub6FZeZ5vwcYiT6r7ZYKJhyUqBxMBvzSmb6SpPQCsSenGPrVjKk5SGW4JJpc7cKERN8w9KnJZcMgJA4B2cHnpGq5TahYrDvZSBY2EMLKPRMTT";
  ret = CfdEncodeBase58(handle, target_data, true, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(exp, output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdDecodeBase58(handle, exp, true, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(target_data, output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}